

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O0

dlb * dlb_fopen(char *name,char *mode)

{
  boolean bVar1;
  FILE *pFVar2;
  dlb *local_30;
  dlb *dp;
  FILE *fp;
  char *mode_local;
  char *name_local;
  
  if (dlb_initialized == '\0') {
    name_local = (char *)0x0;
  }
  else {
    local_30 = (dlb *)malloc(0x28);
    bVar1 = (*dlb_procs->dlb_fopen_proc)(local_30,name,mode);
    if (bVar1 == '\0') {
      pFVar2 = fopen_datafile(name,mode);
      if (pFVar2 == (FILE *)0x0) {
        free(local_30);
        local_30 = (dlb *)0x0;
      }
      else {
        local_30->fp = pFVar2;
      }
    }
    else {
      local_30->fp = (FILE *)0x0;
    }
    name_local = (char *)local_30;
  }
  return (dlb *)name_local;
}

Assistant:

dlb *dlb_fopen(const char *name, const char *mode)
{
    FILE *fp;
    dlb *dp;

    if (!dlb_initialized) return NULL;

    dp = malloc(sizeof(dlb));
    if (do_dlb_fopen(dp, name, mode))
    	dp->fp = NULL;
    else if ((fp = fopen_datafile(name, mode, DATAPREFIX)) != 0)
	dp->fp = fp;
    else {
	/* can't find anything */
	free(dp);
	dp = NULL;
	}

    return dp;
}